

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  int iVar2;
  uint32 uVar3;
  uint uVar4;
  void *__src;
  uint8 *puVar5;
  long *in_RDX;
  uint8 *in_RSI;
  CodeGeneratorRequest *in_RDI;
  uint n_1;
  uint i_1;
  string *s;
  int n;
  int i;
  uint32 cached_has_bits;
  ptrdiff_t size;
  uint8 **in_stack_fffffffffffffe78;
  CodeGeneratorRequest *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  uint8 *in_stack_fffffffffffffe90;
  EpsCopyOutputStream *in_stack_fffffffffffffe98;
  EpsCopyOutputStream *in_stack_fffffffffffffea0;
  long *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  uint local_13c;
  FileDescriptorProto *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int iVar6;
  uint uVar7;
  uint8 *local_118;
  EpsCopyOutputStream *in_stack_ffffffffffffff28;
  uint8 *in_stack_ffffffffffffff30;
  FileDescriptorProto *in_stack_ffffffffffffff38;
  uint8 *local_b0;
  
  iVar6 = 0;
  iVar1 = _internal_file_to_generate_size((CodeGeneratorRequest *)0x4b22a5);
  local_118 = in_RSI;
  for (; iVar6 < iVar1; iVar6 = iVar6 + 1) {
    in_stack_fffffffffffffec8 =
         (FileDescriptorProto *)
         _internal_file_to_generate_abi_cxx11_
                   (in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    in_stack_fffffffffffffea0 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffea0,iVar2,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    in_stack_fffffffffffffea8 = in_RDX;
    in_stack_ffffffffffffff38 = in_stack_fffffffffffffec8;
    in_stack_ffffffffffffff28 = (EpsCopyOutputStream *)std::__cxx11::string::size();
    in_stack_fffffffffffffeb7 = true;
    in_stack_ffffffffffffff30 = local_118;
    if ((long)in_stack_ffffffffffffff28 < 0x80) {
      in_stack_fffffffffffffe98 =
           (EpsCopyOutputStream *)((*in_stack_fffffffffffffea8 - (long)local_118) + 0x10);
      iVar2 = io::EpsCopyOutputStream::TagSize(8);
      in_stack_fffffffffffffeb7 =
           (long)in_stack_fffffffffffffe98 + (-1 - (long)iVar2) < (long)in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff30 = local_118;
    }
    if ((bool)in_stack_fffffffffffffeb7 == false) {
      *in_stack_ffffffffffffff30 = '\n';
      in_stack_fffffffffffffe90 = in_stack_ffffffffffffff30 + 2;
      in_stack_ffffffffffffff30[1] = (uint8)in_stack_ffffffffffffff28;
      in_stack_ffffffffffffff30 = in_stack_fffffffffffffe90;
      __src = (void *)std::__cxx11::string::data();
      memcpy(in_stack_fffffffffffffe90,__src,(size_t)in_stack_ffffffffffffff28);
      local_b0 = in_stack_ffffffffffffff30 + (long)in_stack_ffffffffffffff28;
    }
    else {
      local_b0 = io::EpsCopyOutputStream::WriteStringOutline
                           (in_stack_fffffffffffffe98,
                            (uint32)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                            in_stack_fffffffffffffe88,(uint8 *)in_stack_fffffffffffffe80);
    }
    local_118 = local_b0;
  }
  uVar7 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    _internal_parameter_abi_cxx11_((CodeGeneratorRequest *)0x4b2616);
    in_stack_fffffffffffffe80 = (CodeGeneratorRequest *)std::__cxx11::string::data();
    _internal_parameter_abi_cxx11_((CodeGeneratorRequest *)0x4b262d);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe80,iVar2,SERIALIZE,
               "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    _internal_parameter_abi_cxx11_((CodeGeneratorRequest *)0x4b2661);
    local_118 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                           (uint32)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           (string *)in_stack_fffffffffffffea0,(uint8 *)in_stack_fffffffffffffe98);
  }
  if ((uVar7 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    _Internal::compiler_version(in_RDI);
    uVar3 = internal::WireFormatLite::MakeTag(3,WIRETYPE_LENGTH_DELIMITED);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_118);
    uVar3 = Version::GetCachedSize((Version *)0x4b2754);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    local_118 = Version::InternalSerializeWithCachedSizesToArray
                          ((Version *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                           (uint8 *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  }
  local_13c = 0;
  uVar4 = _internal_proto_file_size((CodeGeneratorRequest *)0x4b279f);
  for (; local_13c < uVar4; local_13c = local_13c + 1) {
    io::EpsCopyOutputStream::EnsureSpace
              ((EpsCopyOutputStream *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    _internal_proto_file(in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20));
    uVar3 = internal::WireFormatLite::MakeTag(0xf,WIRETYPE_LENGTH_DELIMITED);
    puVar5 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_118);
    uVar3 = FileDescriptorProto::GetCachedSize((FileDescriptorProto *)0x4b287c);
    io::CodedOutputStream::WriteVarint32ToArray(uVar3,puVar5);
    local_118 = FileDescriptorProto::InternalSerializeWithCachedSizesToArray
                          (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_118 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)CONCAT44(uVar7,iVar6),
                           (uint8 *)CONCAT44(iVar1,in_stack_fffffffffffffed0),
                           (EpsCopyOutputStream *)in_stack_fffffffffffffec8);
  }
  return local_118;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->_internal_file_to_generate_size(); i < n; i++) {
    const auto& s = this->_internal_file_to_generate(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_parameter().data(), static_cast<int>(this->_internal_parameter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::compiler_version(this), target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_proto_file_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(15, this->_internal_proto_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}